

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int uECC_make_key(uint8_t *public_key,uint8_t *private_key,uECC_Curve curve)

{
  int iVar1;
  uECC_word_t uVar2;
  ulong local_90;
  uECC_word_t tries;
  uECC_word_t _public [8];
  uECC_word_t _private [4];
  uECC_Curve curve_local;
  uint8_t *private_key_local;
  uint8_t *public_key_local;
  
  local_90 = 0;
  while( true ) {
    if (0x3f < local_90) {
      return 0;
    }
    iVar1 = uECC_generate_random_int
                      (_public + 7,curve->n,(wordcount_t)((curve->num_n_bits + 0x3f) / 0x40));
    if (iVar1 == 0) break;
    uVar2 = EccPoint_compute_public_key(&tries,_public + 7,curve);
    if (uVar2 != 0) {
      uECC_vli_nativeToBytes(private_key,(curve->num_n_bits + 7) / 8,_public + 7);
      uECC_vli_nativeToBytes(public_key,(int)curve->num_bytes,&tries);
      uECC_vli_nativeToBytes
                (public_key + (int)curve->num_bytes,(int)curve->num_bytes,
                 _public + (long)(int)curve->num_words + -1);
      return 1;
    }
    local_90 = local_90 + 1;
  }
  return 0;
}

Assistant:

int uECC_make_key(uint8_t *public_key,
                  uint8_t *private_key,
                  uECC_Curve curve) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *_private = (uECC_word_t *)private_key;
    uECC_word_t *_public = (uECC_word_t *)public_key;
#else
    uECC_word_t _private[uECC_MAX_WORDS];
    uECC_word_t _public[uECC_MAX_WORDS * 2];
#endif
    uECC_word_t tries;

    for (tries = 0; tries < uECC_RNG_MAX_TRIES; ++tries) {
        if (!uECC_generate_random_int(_private, curve->n, BITS_TO_WORDS(curve->num_n_bits))) {
            return 0;
        }

        if (EccPoint_compute_public_key(_public, _private, curve)) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
            uECC_vli_nativeToBytes(private_key, BITS_TO_BYTES(curve->num_n_bits), _private);
            uECC_vli_nativeToBytes(public_key, curve->num_bytes, _public);
            uECC_vli_nativeToBytes(
                public_key + curve->num_bytes, curve->num_bytes, _public + curve->num_words);
#endif
            return 1;
        }
    }
    return 0;
}